

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::fill_composite_constant
          (CompilerGLSL *this,SPIRConstant *constant,TypeID type_id,
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *initializers)

{
  bool bVar1;
  uint32_t id;
  SPIRType *type_00;
  TypedID<(spirv_cross::Types)3> *pTVar2;
  CompilerError *this_00;
  uint local_38;
  uint local_34;
  uint32_t i_1;
  uint32_t i;
  SPIRType *type;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *initializers_local;
  SPIRConstant *constant_local;
  CompilerGLSL *this_local;
  TypeID type_id_local;
  
  this_local._4_4_ = type_id.id;
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&this_local + 4));
  type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,id);
  constant->specialization = true;
  bVar1 = Compiler::is_array(&this->super_Compiler,type_00);
  if ((bVar1) || (type_00->basetype == Struct)) {
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
              (&constant->subconstants,initializers);
  }
  else {
    bVar1 = Compiler::is_matrix(&this->super_Compiler,type_00);
    if (bVar1) {
      (constant->m).columns = type_00->columns;
      for (local_34 = 0; local_34 < type_00->columns; local_34 = local_34 + 1) {
        pTVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                           (&initializers->
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>,
                            (ulong)local_34);
        TypedID<(spirv_cross::Types)0>::operator=((constant->m).id + local_34,pTVar2);
        (constant->m).c[local_34].vecsize = type_00->vecsize;
      }
    }
    else {
      bVar1 = Compiler::is_vector(&this->super_Compiler,type_00);
      if (!bVar1) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Unexpected scalar in SpecConstantOp CompositeInsert!")
        ;
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      (constant->m).c[0].vecsize = type_00->vecsize;
      for (local_38 = 0; local_38 < type_00->vecsize; local_38 = local_38 + 1) {
        pTVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>::operator[]
                           (&initializers->
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>,
                            (ulong)local_38);
        TypedID<(spirv_cross::Types)0>::operator=((constant->m).c[0].id + local_38,pTVar2);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::fill_composite_constant(SPIRConstant &constant, TypeID type_id,
                                           const SmallVector<ConstantID> &initializers)
{
	auto &type = get<SPIRType>(type_id);
	constant.specialization = true;
	if (is_array(type) || type.basetype == SPIRType::Struct)
	{
		constant.subconstants = initializers;
	}
	else if (is_matrix(type))
	{
		constant.m.columns = type.columns;
		for (uint32_t i = 0; i < type.columns; ++i)
		{
			constant.m.id[i] = initializers[i];
			constant.m.c[i].vecsize = type.vecsize;
		}
	}
	else if (is_vector(type))
	{
		constant.m.c[0].vecsize = type.vecsize;
		for (uint32_t i = 0; i < type.vecsize; ++i)
			constant.m.c[0].id[i] = initializers[i];
	}
	else
		SPIRV_CROSS_THROW("Unexpected scalar in SpecConstantOp CompositeInsert!");
}